

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

void __thiscall
kratos::PortPackedVisitor::process_struct_
          (PortPackedVisitor *this,PackedStruct *struct_def,Var *var)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*>_>_>
  *this_00;
  pointer pcVar1;
  bool bVar2;
  iterator iVar3;
  mapped_type *ppPVar4;
  VarException *this_01;
  mapped_type *ppVVar5;
  PackedStructFieldDef *attr;
  pointer pcVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  initializer_list<const_kratos::IRNode_*> __l;
  string local_88;
  Var *local_68;
  mapped_type local_60;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_58;
  Var *local_38;
  Var *var_local;
  PackedStruct *struct_def_local;
  
  this_00 = &this->structs_;
  local_38 = var;
  var_local = (Var *)struct_def;
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*>_>_>
          ::find(&this_00->_M_t,&struct_def->struct_name);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->structs_)._M_t._M_impl.super__Rb_tree_header) {
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::PackedStruct_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,kratos::PackedStruct_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::PackedStruct_const*>>>
    ::_M_emplace_unique<std::__cxx11::string&,kratos::PackedStruct*&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::PackedStruct_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,kratos::PackedStruct_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::PackedStruct_const*>>>
                *)this_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)var_local,
               (PackedStruct **)&var_local);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Var*>,std::_Select1st<std::pair<std::__cxx11::string_const,kratos::Var*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Var*>>>
    ::_M_emplace_unique<std::__cxx11::string&,kratos::Var*&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Var*>,std::_Select1st<std::pair<std::__cxx11::string_const,kratos::Var*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Var*>>>
                *)&this->struct_ports_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)var_local,
               &local_38);
    pcVar1 = (var_local->super_IRNode).comment._M_dataplus._M_p;
    for (pcVar6 = *(pointer *)&(var_local->super_IRNode).verilog_ln; pcVar6 != pcVar1;
        pcVar6 = pcVar6 + 0x30) {
      if (*(PackedStruct **)(pcVar6 + 0x28) != (PackedStruct *)0x0) {
        process_struct_(this,*(PackedStruct **)(pcVar6 + 0x28),local_38);
      }
    }
  }
  else {
    ppPVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_kratos::PackedStruct_*>_>_>
              ::at(this_00,(key_type *)var_local);
    bVar2 = PackedStruct::same((PackedStruct *)var_local,*ppPVar4);
    if (!bVar2) {
      this_01 = (VarException *)__cxa_allocate_exception(0x10);
      local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)(var_local->super_IRNode)._vptr_IRNode;
      local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (pointer)(var_local->super_IRNode).fn_name_ln.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      format_str.size_ = 0xd;
      format_str.data_ = (char *)0x2b;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_58;
      fmt::v7::detail::vformat_abi_cxx11_
                (&local_88,(detail *)"redefinition of different packed struct {0}",format_str,args);
      local_68 = local_38;
      ppVVar5 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
                ::at(&this->struct_ports_,(key_type *)var_local);
      local_60 = *ppVVar5;
      __l._M_len = 2;
      __l._M_array = (iterator)&local_68;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_58,__l,(allocator_type *)((long)&struct_def_local + 7));
      VarException::VarException(this_01,&local_88,&local_58);
      __cxa_throw(this_01,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void process_struct_(PackedStruct* struct_def, Var* var) {
        if (structs_.find(struct_def->struct_name) != structs_.end()) {
            // do some checking
            auto const* struct_ = structs_.at(struct_def->struct_name);
            if (!struct_def->same(*struct_)) {
                throw VarException(::format("redefinition of different packed struct {0}",
                                            struct_def->struct_name),
                                   {var, struct_ports_.at(struct_def->struct_name)});
            }
        } else {
            structs_.emplace(struct_def->struct_name, struct_def);
            struct_ports_.emplace(struct_def->struct_name, var);

            // check if there is any struct inside attributes
            for (auto const& attr : struct_def->attributes) {
                if (attr.struct_) {
                    process_struct_(attr.struct_, var);
                }
            }
        }
    }